

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# singleton.h
# Opt level: O0

void mwheel::
     Singleton<mwheel::PrototypeFactory<mwheel::test::ClientInterface,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mwheel::test::ClientInterface>_>_>
     ::check_creator(void)

{
  bool bVar1;
  ostream *poVar2;
  char *pcVar3;
  creator_not_set *this;
  stringstream estream;
  creator_type *creator;
  string *in_stack_fffffffffffffe08;
  function<std::shared_ptr<mwheel::PrototypeFactory<mwheel::test::ClientInterface,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mwheel::test::ClientInterface>_>_>_()>
  *in_stack_fffffffffffffe10;
  stringstream local_190 [16];
  ostream local_180 [376];
  creator_type *local_8;
  
  local_8 = get_creator();
  bVar1 = std::function::operator_cast_to_bool(in_stack_fffffffffffffe10);
  if (!bVar1) {
    std::__cxx11::stringstream::stringstream(local_190);
    poVar2 = std::operator<<(local_180,"ERROR : in Singleton ");
    pcVar3 = std::type_info::name
                       ((type_info *)
                        &Singleton<mwheel::PrototypeFactory<mwheel::test::ClientInterface,std::__cxx11::string,std::shared_ptr<mwheel::test::ClientInterface>>>
                         ::typeinfo);
    poVar2 = std::operator<<(poVar2,pcVar3);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<(local_180,"\tcreator not set");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<(local_180,
                             "\tMaybe you forgot to call \"set_creator\" before retrieving the singleton instance?"
                            );
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    this = (creator_not_set *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringstream::str();
    creator_not_set::creator_not_set(this,in_stack_fffffffffffffe08);
    __cxa_throw(this,&Singleton<mwheel::PrototypeFactory<mwheel::test::ClientInterface,std::__cxx11::string,std::shared_ptr<mwheel::test::ClientInterface>>>
                      ::creator_not_set::typeinfo,creator_not_set::~creator_not_set);
  }
  return;
}

Assistant:

static void check_creator() {
    auto &creator = get_creator();
    if (!creator) {
      // Using auto with an std::stringstream is a PITA!
      std::stringstream estream;
      estream << "ERROR : in Singleton " << typeid(Singleton).name() << std::endl;
      estream << "\tcreator not set" << std::endl;
      estream
          << "\tMaybe you forgot to call \"set_creator\" before retrieving the singleton instance?"
          << std::endl;
      throw creator_not_set(estream.str());
    }
  }